

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_set_nonce_len(mbedtls_ctr_drbg_context *ctx,size_t len)

{
  size_t len_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  if (ctx->f_entropy == (mbedtls_ssl_recv_t *)0x0) {
    if (len < 0x181) {
      if (len < 0x80000000) {
        ctx->reseed_counter = (int)len;
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = -0x38;
      }
    }
    else {
      ctx_local._4_4_ = -0x38;
    }
  }
  else {
    ctx_local._4_4_ = -0x34;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_set_nonce_len(mbedtls_ctr_drbg_context *ctx,
                                   size_t len)
{
    /* If mbedtls_ctr_drbg_seed() has already been called, it's
     * too late. Return the error code that's closest to making sense. */
    if (ctx->f_entropy != NULL) {
        return MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED;
    }

    if (len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    /* This shouldn't be an issue because
     * MBEDTLS_CTR_DRBG_MAX_SEED_INPUT < INT_MAX in any sensible
     * configuration, but make sure anyway. */
    if (len > INT_MAX) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    /* For backward compatibility with Mbed TLS <= 2.19, store the
     * entropy nonce length in a field that already exists, but isn't
     * used until after the initial seeding. */
    /* Due to the capping of len above, the value fits in an int. */
    ctx->reseed_counter = (int) len;
    return 0;
}